

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O1

TargetList * Analyser::Static::GetTargets(TargetList *__return_storage_ptr__,string *file_name)

{
  pointer puVar1;
  Target *pTVar2;
  pointer psVar3;
  __normal_iterator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_*,_std::vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>_>
  __seed;
  pointer psVar4;
  int iVar5;
  TargetList *__range1;
  shared_ptr<Storage::Tape::Tape> *tape;
  long lVar6;
  pointer psVar7;
  unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_> *target;
  unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_> *puVar8;
  pointer puVar9;
  IntType potential_platforms;
  vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  new_targets;
  Media media;
  string extension;
  uint local_c4;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_*,_std::vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>
  local_c0;
  Media local_a8;
  string local_48;
  
  anon_unknown.dwarf_41f54f::get_extension(&local_48,file_name);
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = std::__cxx11::string::compare((char *)&local_48);
  if (iVar5 == 0) {
    Storage::State::SNA::load((SNA *)&local_a8,file_name);
    psVar4 = local_a8.disks.
             super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_a8.disks.
        super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      std::
      vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
      ::
      emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                  *)&local_a8);
    }
    if (local_a8.disks.
        super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)((local_a8.disks.
                  super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                _vptr_Disk)();
    }
    if (psVar4 != (pointer)0x0) goto LAB_0017503d;
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_48);
  if (iVar5 == 0) {
    Storage::State::SZX::load((SZX *)&local_a8,file_name);
    psVar4 = local_a8.disks.
             super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_a8.disks.
        super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      std::
      vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
      ::
      emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                  *)&local_a8);
    }
    if (local_a8.disks.
        super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)((local_a8.disks.
                  super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                _vptr_Disk)();
    }
    if (psVar4 != (pointer)0x0) goto LAB_0017503d;
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_48);
  if (iVar5 == 0) {
    Storage::State::Z80::load((Z80 *)&local_a8,file_name);
    psVar4 = local_a8.disks.
             super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_a8.disks.
        super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      std::
      vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
      ::
      emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                  *)&local_a8);
    }
    if (local_a8.disks.
        super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)((local_a8.disks.
                  super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                _vptr_Disk)();
    }
    if (psVar4 != (pointer)0x0) goto LAB_0017503d;
  }
  local_c4 = 0;
  GetMediaAndPlatforms(&local_a8,file_name,(IntType *)&local_c4);
  if ((local_c4 & 0x760) != 0) {
    Acorn::GetTargets((TargetList *)&local_c0,&local_a8,file_name,local_c4);
    lVar6 = local_c0._M_len - local_c0._M_original_len >> 3;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      puVar8 = (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_c0._M_original_len;
      do {
        std::
        vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
        ::
        emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                  ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                    *)__return_storage_ptr__,puVar8);
        puVar8 = puVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::~vector((vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
               *)&local_c0);
  }
  if ((local_c4 & 1) != 0) {
    AmstradCPC::GetTargets((TargetList *)&local_c0,&local_a8,file_name,local_c4);
    lVar6 = local_c0._M_len - local_c0._M_original_len >> 3;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      puVar8 = (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_c0._M_original_len;
      do {
        std::
        vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
        ::
        emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                  ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                    *)__return_storage_ptr__,puVar8);
        puVar8 = puVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::~vector((vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
               *)&local_c0);
  }
  if ((local_c4 & 2) != 0) {
    AppleII::GetTargets((TargetList *)&local_c0,&local_a8,file_name,local_c4);
    lVar6 = local_c0._M_len - local_c0._M_original_len >> 3;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      puVar8 = (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_c0._M_original_len;
      do {
        std::
        vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
        ::
        emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                  ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                    *)__return_storage_ptr__,puVar8);
        puVar8 = puVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::~vector((vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
               *)&local_c0);
  }
  if ((local_c4 & 4) != 0) {
    AppleIIgs::GetTargets((TargetList *)&local_c0,&local_a8,file_name,local_c4);
    lVar6 = local_c0._M_len - local_c0._M_original_len >> 3;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      puVar8 = (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_c0._M_original_len;
      do {
        std::
        vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
        ::
        emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                  ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                    *)__return_storage_ptr__,puVar8);
        puVar8 = puVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::~vector((vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
               *)&local_c0);
  }
  if ((char)local_c4 < '\0') {
    Amiga::GetTargets((TargetList *)&local_c0,&local_a8,file_name,local_c4);
    lVar6 = local_c0._M_len - local_c0._M_original_len >> 3;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      puVar8 = (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_c0._M_original_len;
      do {
        std::
        vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
        ::
        emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                  ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                    *)__return_storage_ptr__,puVar8);
        puVar8 = puVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::~vector((vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
               *)&local_c0);
  }
  if ((local_c4 & 8) != 0) {
    Atari2600::GetTargets((TargetList *)&local_c0,&local_a8,file_name,local_c4);
    lVar6 = local_c0._M_len - local_c0._M_original_len >> 3;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      puVar8 = (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_c0._M_original_len;
      do {
        std::
        vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
        ::
        emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                  ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                    *)__return_storage_ptr__,puVar8);
        puVar8 = puVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::~vector((vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
               *)&local_c0);
  }
  if ((local_c4 & 0x10) != 0) {
    AtariST::GetTargets((TargetList *)&local_c0,&local_a8,file_name,local_c4);
    lVar6 = local_c0._M_len - local_c0._M_original_len >> 3;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      puVar8 = (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_c0._M_original_len;
      do {
        std::
        vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
        ::
        emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                  ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                    *)__return_storage_ptr__,puVar8);
        puVar8 = puVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::~vector((vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
               *)&local_c0);
  }
  if ((local_c4 >> 0xb & 1) != 0) {
    Coleco::GetTargets((TargetList *)&local_c0,&local_a8,file_name,local_c4);
    lVar6 = local_c0._M_len - local_c0._M_original_len >> 3;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      puVar8 = (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_c0._M_original_len;
      do {
        std::
        vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
        ::
        emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                  ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                    *)__return_storage_ptr__,puVar8);
        puVar8 = puVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::~vector((vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
               *)&local_c0);
  }
  if ((local_c4 >> 0xc & 1) != 0) {
    Commodore::GetTargets((TargetList *)&local_c0,&local_a8,file_name,local_c4);
    lVar6 = local_c0._M_len - local_c0._M_original_len >> 3;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      puVar8 = (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_c0._M_original_len;
      do {
        std::
        vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
        ::
        emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                  ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                    *)__return_storage_ptr__,puVar8);
        puVar8 = puVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::~vector((vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
               *)&local_c0);
  }
  if ((local_c4 >> 0xd & 1) != 0) {
    DiskII::GetTargets((TargetList *)&local_c0,&local_a8,file_name,local_c4);
    lVar6 = local_c0._M_len - local_c0._M_original_len >> 3;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      puVar8 = (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_c0._M_original_len;
      do {
        std::
        vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
        ::
        emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                  ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                    *)__return_storage_ptr__,puVar8);
        puVar8 = puVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::~vector((vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
               *)&local_c0);
  }
  if ((local_c4 >> 0xe & 1) != 0) {
    Enterprise::GetTargets((TargetList *)&local_c0,&local_a8,file_name,local_c4);
    lVar6 = local_c0._M_len - local_c0._M_original_len >> 3;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      puVar8 = (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_c0._M_original_len;
      do {
        std::
        vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
        ::
        emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                  ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                    *)__return_storage_ptr__,puVar8);
        puVar8 = puVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::~vector((vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
               *)&local_c0);
  }
  if ((local_c4 >> 0x17 & 1) != 0) {
    FAT12::GetTargets((TargetList *)&local_c0,&local_a8,file_name,local_c4);
    lVar6 = local_c0._M_len - local_c0._M_original_len >> 3;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      puVar8 = (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_c0._M_original_len;
      do {
        std::
        vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
        ::
        emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                  ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                    *)__return_storage_ptr__,puVar8);
        puVar8 = puVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::~vector((vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
               *)&local_c0);
  }
  if ((local_c4 >> 0x10 & 1) != 0) {
    Macintosh::GetTargets((TargetList *)&local_c0,&local_a8,file_name,local_c4);
    lVar6 = local_c0._M_len - local_c0._M_original_len >> 3;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      puVar8 = (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_c0._M_original_len;
      do {
        std::
        vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
        ::
        emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                  ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                    *)__return_storage_ptr__,puVar8);
        puVar8 = puVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::~vector((vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
               *)&local_c0);
  }
  if ((local_c4 >> 0x11 & 1) != 0) {
    MSX::GetTargets((TargetList *)&local_c0,&local_a8,file_name,local_c4);
    lVar6 = local_c0._M_len - local_c0._M_original_len >> 3;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      puVar8 = (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_c0._M_original_len;
      do {
        std::
        vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
        ::
        emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                  ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                    *)__return_storage_ptr__,puVar8);
        puVar8 = puVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::~vector((vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
               *)&local_c0);
  }
  if ((local_c4 >> 0x12 & 1) != 0) {
    Oric::GetTargets((TargetList *)&local_c0,&local_a8,file_name,local_c4);
    lVar6 = local_c0._M_len - local_c0._M_original_len >> 3;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      puVar8 = (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_c0._M_original_len;
      do {
        std::
        vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
        ::
        emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                  ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                    *)__return_storage_ptr__,puVar8);
        puVar8 = puVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::~vector((vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
               *)&local_c0);
  }
  if ((local_c4 >> 0x16 & 1) != 0) {
    PCCompatible::GetTargets((TargetList *)&local_c0,&local_a8,file_name,local_c4);
    lVar6 = local_c0._M_len - local_c0._M_original_len >> 3;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      puVar8 = (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_c0._M_original_len;
      do {
        std::
        vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
        ::
        emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                  ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                    *)__return_storage_ptr__,puVar8);
        puVar8 = puVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::~vector((vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
               *)&local_c0);
  }
  if ((short)local_c4 < 0) {
    Sega::GetTargets((TargetList *)&local_c0,&local_a8,file_name,local_c4);
    lVar6 = local_c0._M_len - local_c0._M_original_len >> 3;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      puVar8 = (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_c0._M_original_len;
      do {
        std::
        vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
        ::
        emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                  ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                    *)__return_storage_ptr__,puVar8);
        puVar8 = puVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::~vector((vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
               *)&local_c0);
  }
  if ((local_c4 & 0x180000) != 0) {
    ZX8081::GetTargets((TargetList *)&local_c0,&local_a8,file_name,local_c4);
    lVar6 = local_c0._M_len - local_c0._M_original_len >> 3;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      puVar8 = (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_c0._M_original_len;
      do {
        std::
        vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
        ::
        emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                  ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                    *)__return_storage_ptr__,puVar8);
        puVar8 = puVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::~vector((vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
               *)&local_c0);
  }
  if ((local_c4 >> 0x15 & 1) != 0) {
    ZXSpectrum::GetTargets((TargetList *)&local_c0,&local_a8,file_name,local_c4);
    lVar6 = local_c0._M_len - local_c0._M_original_len >> 3;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      puVar8 = (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_c0._M_original_len;
      do {
        std::
        vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
        ::
        emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
                  ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                    *)__return_storage_ptr__,puVar8);
        puVar8 = puVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::~vector((vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
               *)&local_c0);
  }
  puVar1 = (__return_storage_ptr__->
           super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (puVar9 = (__return_storage_ptr__->
                super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar1; puVar9 = puVar9 + 1) {
    pTVar2 = (puVar9->_M_t).
             super___uniq_ptr_impl<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
             ._M_t.
             super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
             .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl;
    psVar3 = *(pointer *)((long)&(pTVar2->media).tapes + 8);
    for (psVar7 = *(pointer *)
                   &(pTVar2->media).tapes.
                    super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
                    ._M_impl; psVar7 != psVar3; psVar7 = psVar7 + 1) {
      Storage::Tape::Tape::reset
                ((psVar7->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
    }
  }
  __seed._M_current =
       (__return_storage_ptr__->
       super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (__return_storage_ptr__->
           super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__seed._M_current != puVar8) {
    lVar6 = (long)puVar8 - (long)__seed._M_current >> 3;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_*,_std::vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>
    ::_Temporary_buffer(&local_c0,__seed,(lVar6 - (lVar6 + 1 >> 0x3f)) + 1 >> 1);
    if (local_c0._M_buffer == (pointer)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>*,std::vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Analyser::Static::GetTargets(std::__cxx11::string_const&)::__2>>
                (__seed._M_current,puVar8);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>*,std::vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<Analyser::Static::GetTargets(std::__cxx11::string_const&)::__2>>
                (__seed._M_current,puVar8,local_c0._M_buffer,local_c0._M_len);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_*,_std::vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>
    ::~_Temporary_buffer(&local_c0);
  }
  std::
  vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
  ::~vector(&local_a8.mass_storage_devices);
  std::
  vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ::~vector(&local_a8.cartridges);
  std::
  vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
  ::~vector(&local_a8.tapes);
  std::
  vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
  ::~vector(&local_a8.disks);
LAB_0017503d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

TargetList Analyser::Static::GetTargets(const std::string &file_name) {
	const std::string extension = get_extension(file_name);
	TargetList targets;

	// Check whether the file directly identifies a target; if so then just return that.
	const auto try_snapshot = [&](const char *ext, auto loader) -> bool {
		if(extension != ext) {
			return false;
		}
		try {
			auto target = loader(file_name);
			if(target) {
				targets.push_back(std::move(target));
				return true;
			}
		} catch(...) {}

		return false;
	};

	if(try_snapshot("sna", Storage::State::SNA::load)) return targets;
	if(try_snapshot("szx", Storage::State::SZX::load)) return targets;
	if(try_snapshot("z80", Storage::State::Z80::load)) return targets;

	// Otherwise:
	//
	// Collect all disks, tapes ROMs, etc as can be extrapolated from this file, forming the
	// union of all platforms this file might be a target for.
	TargetPlatform::IntType potential_platforms = 0;
	Media media = GetMediaAndPlatforms(file_name, potential_platforms);

	// Hand off to platform-specific determination of whether these
	// things are actually compatible and, if so, how to load them.
	const auto append = [&](TargetPlatform::IntType platform, auto evaluator) {
		if(!(potential_platforms & platform)) {
			return;
		}
		auto new_targets = evaluator(media, file_name, potential_platforms);
		std::move(new_targets.begin(), new_targets.end(), std::back_inserter(targets));
	};

	append(TargetPlatform::Acorn, Acorn::GetTargets);
	append(TargetPlatform::AmstradCPC, AmstradCPC::GetTargets);
	append(TargetPlatform::AppleII, AppleII::GetTargets);
	append(TargetPlatform::AppleIIgs, AppleIIgs::GetTargets);
	append(TargetPlatform::Amiga, Amiga::GetTargets);
	append(TargetPlatform::Atari2600, Atari2600::GetTargets);
	append(TargetPlatform::AtariST, AtariST::GetTargets);
	append(TargetPlatform::Coleco, Coleco::GetTargets);
	append(TargetPlatform::Commodore, Commodore::GetTargets);
	append(TargetPlatform::DiskII, DiskII::GetTargets);
	append(TargetPlatform::Enterprise, Enterprise::GetTargets);
	append(TargetPlatform::FAT12, FAT12::GetTargets);
	append(TargetPlatform::Macintosh, Macintosh::GetTargets);
	append(TargetPlatform::MSX, MSX::GetTargets);
	append(TargetPlatform::Oric, Oric::GetTargets);
	append(TargetPlatform::PCCompatible, PCCompatible::GetTargets);
	append(TargetPlatform::Sega, Sega::GetTargets);
	append(TargetPlatform::ZX8081, ZX8081::GetTargets);
	append(TargetPlatform::ZXSpectrum, ZXSpectrum::GetTargets);

	// Reset any tapes to their initial position.
	for(const auto &target : targets) {
		for(auto &tape : target->media.tapes) {
			tape->reset();
		}
	}

	// Sort by initial confidence. Use a stable sort in case any of the machine-specific analysers
	// picked their insertion order carefully.
	std::stable_sort(targets.begin(), targets.end(),
		[] (const std::unique_ptr<Target> &a, const std::unique_ptr<Target> &b) {
			return a->confidence > b->confidence;
		});

	return targets;
}